

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

vector<Range,_std::allocator<Range>_> * __thiscall
TextBuffer::Layer::find_all_in_range
          (vector<Range,_std::allocator<Range>_> *__return_storage_ptr__,Layer *this,Regex *regex,
          Range range,bool splay)

{
  anon_class_8_1_6971b95b local_18;
  
  (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18.result = __return_storage_ptr__;
  scan_in_range<TextBuffer::Layer::find_all_in_range(Regex_const&,Range,bool)::_lambda(Range)_1_>
            (this,regex,range,&local_18,splay);
  return __return_storage_ptr__;
}

Assistant:

vector<Range> find_all_in_range(const Regex &regex, Range range, bool splay = false) {
    vector<Range> result;
    scan_in_range(regex, range, [&result](Range match_range) -> bool {
      result.push_back(match_range);
      return false;
    }, splay);
    return result;
  }